

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newConcurrencyLimitingHttpClient
          (kj *this,HttpClient *inner,uint maxConcurrentRequests,
          Function<void_(unsigned_int,_unsigned_int)> *countChangedCallback)

{
  long lVar1;
  Disposer *pDVar2;
  Iface *pIVar3;
  undefined8 *puVar4;
  void *pvVar5;
  HttpClient *extraout_RDX;
  _Map_pointer __n;
  long *plVar6;
  long *plVar7;
  bool bVar8;
  Own<kj::HttpClient,_std::nullptr_t> OVar9;
  
  puVar4 = (undefined8 *)operator_new(0x78);
  pDVar2 = (countChangedCallback->impl).disposer;
  pIVar3 = (countChangedCallback->impl).ptr;
  (countChangedCallback->impl).ptr = (Iface *)0x0;
  *puVar4 = &PTR_request_00704b80;
  puVar4[1] = inner;
  *(uint *)(puVar4 + 2) = maxConcurrentRequests;
  *(undefined4 *)((long)puVar4 + 0x14) = 0;
  puVar4[3] = pDVar2;
  puVar4[4] = pIVar3;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  puVar4[9] = 0;
  puVar4[10] = 0;
  puVar4[0xb] = 0;
  puVar4[0xc] = 0;
  puVar4[0xd] = 0;
  puVar4[0xe] = 0;
  puVar4[6] = 8;
  pvVar5 = operator_new(0x40);
  puVar4[5] = pvVar5;
  plVar6 = (long *)((puVar4[6] * 4 - 4U & 0xfffffffffffffff8) + (long)pvVar5);
  plVar7 = plVar6;
  do {
    pvVar5 = operator_new(0x200);
    *plVar7 = (long)pvVar5;
    bVar8 = plVar7 < plVar6;
    plVar7 = plVar7 + 1;
  } while (bVar8);
  puVar4[10] = plVar6;
  lVar1 = *plVar6;
  puVar4[8] = lVar1;
  puVar4[9] = lVar1 + 0x200;
  puVar4[0xe] = plVar6;
  puVar4[0xc] = lVar1;
  puVar4[0xd] = lVar1 + 0x200;
  puVar4[7] = lVar1;
  puVar4[0xb] = lVar1;
  *(undefined8 **)this =
       &_::HeapDisposer<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient>::instance;
  *(undefined8 **)(this + 8) = puVar4;
  OVar9.ptr = extraout_RDX;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

kj::Own<HttpClient> newConcurrencyLimitingHttpClient(
    HttpClient& inner, uint maxConcurrentRequests,
    kj::Function<void(uint runningCount, uint pendingCount)> countChangedCallback) {
  return kj::heap<ConcurrencyLimitingHttpClient>(inner, maxConcurrentRequests,
      kj::mv(countChangedCallback));
}